

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IndexMergeLevel(Fts5Index *p,Fts5Structure **ppStruct,int iLvl,int *pnRem)

{
  Fts5Structure **p_00;
  int iVar1;
  u8 *pData;
  i64 iRowid;
  bool local_11d;
  int local_11c;
  int local_114;
  int nMove;
  int i;
  u8 *pTerm;
  int nTerm;
  int nPos;
  Fts5SegIter *pSegIter;
  int local_f0;
  int iSegid;
  int bTermWritten;
  int flags;
  int eDetail;
  int bOldest;
  Fts5Buffer term;
  Fts5StructureSegment *pSeg;
  Fts5SegWriter writer;
  int nInput;
  int nRem;
  Fts5Iter *pIter;
  Fts5StructureLevel *pLvlOut;
  Fts5StructureLevel *pLvl;
  Fts5Structure *pStruct;
  int *pnRem_local;
  Fts5Structure **ppFStack_18;
  int iLvl_local;
  Fts5Structure **ppStruct_local;
  Fts5Index *p_local;
  
  pLvl = (Fts5StructureLevel *)*ppStruct;
  pLvlOut = ((Fts5Structure *)pLvl)->aLevel + iLvl;
  _nInput = (Fts5Iter *)0x0;
  if (pnRem == (int *)0x0) {
    local_11c = 0;
  }
  else {
    local_11c = *pnRem;
  }
  writer._116_4_ = local_11c;
  bTermWritten = p->pConfig->eDetail;
  iSegid = 0x20;
  local_f0 = 0;
  pStruct = (Fts5Structure *)pnRem;
  pnRem_local._4_4_ = iLvl;
  ppFStack_18 = ppStruct;
  ppStruct_local = (Fts5Structure **)p;
  memset(&pSeg,0,0x78);
  memset(&eDetail,0,0x10);
  if (pLvlOut->nMerge == 0) {
    pSegIter._4_4_ = fts5AllocateSegid((Fts5Index *)ppStruct_local,(Fts5Structure *)pLvl);
    if (pnRem_local._4_4_ == pLvl[1].nSeg + -1) {
      fts5StructureAddLevel((int *)((long)ppStruct_local + 0x34),ppFStack_18);
      pLvl = (Fts5StructureLevel *)*ppFStack_18;
    }
    fts5StructureExtendLevel
              ((int *)((long)ppStruct_local + 0x34),(Fts5Structure *)pLvl,pnRem_local._4_4_ + 1,1,0)
    ;
    if (*(int *)((long)ppStruct_local + 0x34) != 0) {
      return;
    }
    pLvlOut = (Fts5StructureLevel *)&pLvl[(long)pnRem_local._4_4_ + 1].aSeg;
    pIter = (Fts5Iter *)&pLvl[(long)(pnRem_local._4_4_ + 1) + 1].aSeg;
    fts5WriteInit((Fts5Index *)ppStruct_local,(Fts5SegWriter *)&pSeg,pSegIter._4_4_);
    term._8_8_ = (pIter->base).pData + (long)*(int *)((long)&(pIter->base).iRowid + 4) * 0xc;
    *(int *)((long)&(pIter->base).iRowid + 4) = *(int *)((long)&(pIter->base).iRowid + 4) + 1;
    *(int *)(term._8_8_ + 4) = 1;
    *(int *)term._8_8_ = pSegIter._4_4_;
    pLvl[1].nMerge = pLvl[1].nMerge + 1;
    writer.iBtPage = pLvlOut->nSeg;
  }
  else {
    pIter = (Fts5Iter *)&pLvl[(long)(pnRem_local._4_4_ + 1) + 1].aSeg;
    writer.iBtPage = pLvlOut->nMerge;
    term._8_8_ = *(long *)((long)pIter + 8) + (long)(*(int *)((long)pIter + 4) + -1) * 0xc;
    fts5WriteInit((Fts5Index *)ppStruct_local,(Fts5SegWriter *)&pSeg,*(int *)term._8_8_);
    writer.iSegid = *(int *)(term._8_8_ + 8) + 1;
    writer.btterm.n = 0;
  }
  local_11d = false;
  if (*(int *)((long)&(pIter->base).iRowid + 4) == 1) {
    local_11d = pLvl[1].nSeg == pnRem_local._4_4_ + 2;
  }
  flags = (int)local_11d;
  fts5MultiIterNew((Fts5Index *)ppStruct_local,(Fts5Structure *)pLvl,0x20,(Fts5Colset *)0x0,
                   (u8 *)0x0,0,pnRem_local._4_4_,writer.iBtPage,(Fts5Iter **)&nInput);
  while (iVar1 = fts5MultiIterEof((Fts5Index *)ppStruct_local,_nInput), iVar1 == 0) {
    _nTerm = _nInput->aSeg + _nInput->aFirst[1].iFirst;
    pData = fts5MultiIterTerm(_nInput,(int *)&pTerm);
    if (((int)pTerm != (int)term.p) ||
       (((int)pTerm != 0 && (iVar1 = memcmp(pData,_eDetail,(long)(int)pTerm), iVar1 != 0)))) {
      if ((pStruct != (Fts5Structure *)0x0) && ((int)writer._116_4_ < writer.iPrevRowid._4_4_))
      break;
      sqlite3Fts5BufferSet
                ((int *)((long)ppStruct_local + 0x34),(Fts5Buffer *)&eDetail,(int)pTerm,pData);
      local_f0 = 0;
    }
    if ((_nTerm->nPos != 0) || ((flags == 0 && (_nTerm->bDel != '\0')))) {
      if ((*(int *)((long)ppStruct_local + 0x34) == 0) && (local_f0 == 0)) {
        fts5WriteAppendTerm((Fts5Index *)ppStruct_local,(Fts5SegWriter *)&pSeg,(int)pTerm,pData);
        local_f0 = 1;
      }
      p_00 = ppStruct_local;
      iRowid = fts5MultiIterRowid(_nInput);
      fts5WriteAppendRowid((Fts5Index *)p_00,(Fts5SegWriter *)&pSeg,iRowid);
      if (bTermWritten == 1) {
        if ((_nTerm->bDel != '\0') &&
           (sqlite3Fts5BufferAppendVarint
                      ((int *)((long)ppStruct_local + 0x34),(Fts5Buffer *)&writer.writer,0),
           0 < _nTerm->nPos)) {
          sqlite3Fts5BufferAppendVarint
                    ((int *)((long)ppStruct_local + 0x34),(Fts5Buffer *)&writer.writer,0);
        }
      }
      else {
        pTerm._4_4_ = _nTerm->nPos * 2 + (uint)_nTerm->bDel;
        sqlite3Fts5BufferAppendVarint
                  ((int *)((long)ppStruct_local + 0x34),(Fts5Buffer *)&writer.writer,
                   (long)pTerm._4_4_);
        fts5ChunkIterate((Fts5Index *)ppStruct_local,_nTerm,&pSeg,fts5MergeChunkCallback);
      }
    }
    fts5MultiIterNext((Fts5Index *)ppStruct_local,_nInput,0,0);
  }
  fts5WriteFinish((Fts5Index *)ppStruct_local,(Fts5SegWriter *)&pSeg,(int *)(term._8_8_ + 8));
  iVar1 = fts5MultiIterEof((Fts5Index *)ppStruct_local,_nInput);
  if (iVar1 == 0) {
    fts5TrimSegments((Fts5Index *)ppStruct_local,_nInput);
    pLvlOut->nMerge = writer.iBtPage;
  }
  else {
    for (local_114 = 0; local_114 < writer.iBtPage; local_114 = local_114 + 1) {
      fts5DataRemoveSegment((Fts5Index *)ppStruct_local,pLvlOut->aSeg[local_114].iSegid);
    }
    if (pLvlOut->nSeg != writer.iBtPage) {
      memmove(pLvlOut->aSeg,pLvlOut->aSeg + writer.iBtPage,
              (long)((pLvlOut->nSeg - writer.iBtPage) * 0xc));
    }
    pLvl[1].nMerge = pLvl[1].nMerge - writer.iBtPage;
    pLvlOut->nSeg = pLvlOut->nSeg - writer.iBtPage;
    pLvlOut->nMerge = 0;
    if (*(int *)(term._8_8_ + 8) == 0) {
      *(int *)((long)&(pIter->base).iRowid + 4) = *(int *)((long)&(pIter->base).iRowid + 4) + -1;
      pLvl[1].nMerge = pLvl[1].nMerge + -1;
    }
  }
  fts5MultiIterFree(_nInput);
  sqlite3Fts5BufferFree((Fts5Buffer *)&eDetail);
  if (pStruct != (Fts5Structure *)0x0) {
    pStruct->nRef = pStruct->nRef - writer.iPrevRowid._4_4_;
  }
  return;
}

Assistant:

static void fts5IndexMergeLevel(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Structure **ppStruct,       /* IN/OUT: Stucture of index */
  int iLvl,                       /* Level to read input from */
  int *pnRem                      /* Write up to this many output leaves */
){
  Fts5Structure *pStruct = *ppStruct;
  Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
  Fts5StructureLevel *pLvlOut;
  Fts5Iter *pIter = 0;       /* Iterator to read input data */
  int nRem = pnRem ? *pnRem : 0;  /* Output leaf pages left to write */
  int nInput;                     /* Number of input segments */
  Fts5SegWriter writer;           /* Writer object */
  Fts5StructureSegment *pSeg;     /* Output segment */
  Fts5Buffer term;
  int bOldest;                    /* True if the output segment is the oldest */
  int eDetail = p->pConfig->eDetail;
  const int flags = FTS5INDEX_QUERY_NOOUTPUT;
  int bTermWritten = 0;           /* True if current term already output */

  assert( iLvl<pStruct->nLevel );
  assert( pLvl->nMerge<=pLvl->nSeg );

  memset(&writer, 0, sizeof(Fts5SegWriter));
  memset(&term, 0, sizeof(Fts5Buffer));
  if( pLvl->nMerge ){
    pLvlOut = &pStruct->aLevel[iLvl+1];
    assert( pLvlOut->nSeg>0 );
    nInput = pLvl->nMerge;
    pSeg = &pLvlOut->aSeg[pLvlOut->nSeg-1];

    fts5WriteInit(p, &writer, pSeg->iSegid);
    writer.writer.pgno = pSeg->pgnoLast+1;
    writer.iBtPage = 0;
  }else{
    int iSegid = fts5AllocateSegid(p, pStruct);

    /* Extend the Fts5Structure object as required to ensure the output
    ** segment exists. */
    if( iLvl==pStruct->nLevel-1 ){
      fts5StructureAddLevel(&p->rc, ppStruct);
      pStruct = *ppStruct;
    }
    fts5StructureExtendLevel(&p->rc, pStruct, iLvl+1, 1, 0);
    if( p->rc ) return;
    pLvl = &pStruct->aLevel[iLvl];
    pLvlOut = &pStruct->aLevel[iLvl+1];

    fts5WriteInit(p, &writer, iSegid);

    /* Add the new segment to the output level */
    pSeg = &pLvlOut->aSeg[pLvlOut->nSeg];
    pLvlOut->nSeg++;
    pSeg->pgnoFirst = 1;
    pSeg->iSegid = iSegid;
    pStruct->nSegment++;

    /* Read input from all segments in the input level */
    nInput = pLvl->nSeg;
  }
  bOldest = (pLvlOut->nSeg==1 && pStruct->nLevel==iLvl+2);

  assert( iLvl>=0 );
  for(fts5MultiIterNew(p, pStruct, flags, 0, 0, 0, iLvl, nInput, &pIter);
      fts5MultiIterEof(p, pIter)==0;
      fts5MultiIterNext(p, pIter, 0, 0)
  ){
    Fts5SegIter *pSegIter = &pIter->aSeg[ pIter->aFirst[1].iFirst ];
    int nPos;                     /* position-list size field value */
    int nTerm;
    const u8 *pTerm;

    pTerm = fts5MultiIterTerm(pIter, &nTerm);
    if( nTerm!=term.n || fts5Memcmp(pTerm, term.p, nTerm) ){
      if( pnRem && writer.nLeafWritten>nRem ){
        break;
      }
      fts5BufferSet(&p->rc, &term, nTerm, pTerm);
      bTermWritten =0;
    }

    /* Check for key annihilation. */
    if( pSegIter->nPos==0 && (bOldest || pSegIter->bDel==0) ) continue;

    if( p->rc==SQLITE_OK && bTermWritten==0 ){
      /* This is a new term. Append a term to the output segment. */
      fts5WriteAppendTerm(p, &writer, nTerm, pTerm);
      bTermWritten = 1;
    }

    /* Append the rowid to the output */
    /* WRITEPOSLISTSIZE */
    fts5WriteAppendRowid(p, &writer, fts5MultiIterRowid(pIter));

    if( eDetail==FTS5_DETAIL_NONE ){
      if( pSegIter->bDel ){
        fts5BufferAppendVarint(&p->rc, &writer.writer.buf, 0);
        if( pSegIter->nPos>0 ){
          fts5BufferAppendVarint(&p->rc, &writer.writer.buf, 0);
        }
      }
    }else{
      /* Append the position-list data to the output */
      nPos = pSegIter->nPos*2 + pSegIter->bDel;
      fts5BufferAppendVarint(&p->rc, &writer.writer.buf, nPos);
      fts5ChunkIterate(p, pSegIter, (void*)&writer, fts5MergeChunkCallback);
    }
  }

  /* Flush the last leaf page to disk. Set the output segment b-tree height
  ** and last leaf page number at the same time.  */
  fts5WriteFinish(p, &writer, &pSeg->pgnoLast);

  if( fts5MultiIterEof(p, pIter) ){
    int i;

    /* Remove the redundant segments from the %_data table */
    for(i=0; i<nInput; i++){
      fts5DataRemoveSegment(p, pLvl->aSeg[i].iSegid);
    }

    /* Remove the redundant segments from the input level */
    if( pLvl->nSeg!=nInput ){
      int nMove = (pLvl->nSeg - nInput) * sizeof(Fts5StructureSegment);
      memmove(pLvl->aSeg, &pLvl->aSeg[nInput], nMove);
    }
    pStruct->nSegment -= nInput;
    pLvl->nSeg -= nInput;
    pLvl->nMerge = 0;
    if( pSeg->pgnoLast==0 ){
      pLvlOut->nSeg--;
      pStruct->nSegment--;
    }
  }else{
    assert( pSeg->pgnoLast>0 );
    fts5TrimSegments(p, pIter);
    pLvl->nMerge = nInput;
  }

  fts5MultiIterFree(pIter);
  fts5BufferFree(&term);
  if( pnRem ) *pnRem -= writer.nLeafWritten;
}